

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void vkt::Draw::createTopologyGroups(TestCaseGroup *testGroup,DrawCommandType cmdType)

{
  TestContext *testCtx;
  _Alloc_hider description;
  long *name;
  char *__s;
  TestNode *node;
  long lVar1;
  string groupName;
  allocator<char> local_a1;
  string local_a0;
  TestContext *local_80;
  TestNode *local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_80 = (TestContext *)(ulong)cmdType;
  lVar1 = 0;
  local_78 = &testGroup->super_TestNode;
  do {
    __s = ::vk::getPrimitiveTopologyName((VkPrimitiveTopology)lVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_a1);
    de::toLower(&local_a0,&local_50);
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Testcases with a specific topology.","");
    name = local_70[0];
    description._M_p = local_a0._M_dataplus._M_p;
    testCtx = local_78->m_testCtx;
    node = (TestNode *)operator_new(0x80);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,(char *)name,description._M_p);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cfcdd8;
    node[1]._vptr_TestNode = (_func_int **)populateSubGroup;
    node[1].m_testCtx = local_80;
    tcu::TestNode::addChild(local_78,node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    lVar1 = lVar1 + 1;
    local_80 = (TestContext *)&local_80[0x2aaaaaa].m_testResultDesc._M_string_length;
  } while (lVar1 != 10);
  return;
}

Assistant:

void createTopologyGroups (tcu::TestCaseGroup* testGroup, const DrawCommandType cmdType)
{
	for (deUint32 idx = 0; idx != vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++idx)
	{
		const vk::VkPrimitiveTopology	topology	= vk::VkPrimitiveTopology(idx);
		const std::string				groupName	= de::toLower(getPrimitiveTopologyName(topology)).substr(22);
		addTestGroup(testGroup, groupName, "Testcases with a specific topology.", populateSubGroup, TestCaseParams(cmdType, topology));
	}
}